

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyMeshT.cc
# Opt level: O3

void __thiscall
OpenMesh::
PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
::calc_vertex_normal_fast
          (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
           *this,VertexHandle _vh,Normal *_n)

{
  value_type _idx;
  PropertyT<OpenMesh::VectorT<double,_3>_> *this_00;
  const_reference pvVar1;
  undefined1 local_48 [8];
  ConstVertexFaceIter vf_it;
  
  (_n->super_VectorDataT<double,_3>).values_[0] = 0.0;
  (_n->super_VectorDataT<double,_3>).values_[1] = 0.0;
  (_n->super_VectorDataT<double,_3>).values_[2] = 0.0;
  Iterators::
  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
  ::GenericCirculatorT
            ((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
              *)local_48,(mesh_ref)this,(VertexHandle)_vh.super_BaseHandle.idx_,false);
  if (vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1) {
    do {
      if (((int)vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ ==
           vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_) &&
         (vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
          idx_ != 0)) {
        return;
      }
      _idx = Iterators::
             GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
             ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                          *)local_48);
      this_00 = PropertyContainer::property<OpenMesh::VectorT<double,3>>
                          ((PropertyContainer *)
                           &(this->
                            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                            ).field_0x68,
                           (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                           (this->
                           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           ).face_normals_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                           super_BaseHandle.idx_);
      pvVar1 = PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                         (this_00,(int)_idx.super_BaseHandle.idx_);
      (_n->super_VectorDataT<double,_3>).values_[0] =
           (pvVar1->super_VectorDataT<double,_3>).values_[0] +
           (_n->super_VectorDataT<double,_3>).values_[0];
      (_n->super_VectorDataT<double,_3>).values_[1] =
           (pvVar1->super_VectorDataT<double,_3>).values_[1] +
           (_n->super_VectorDataT<double,_3>).values_[1];
      (_n->super_VectorDataT<double,_3>).values_[2] =
           (pvVar1->super_VectorDataT<double,_3>).values_[2] +
           (_n->super_VectorDataT<double,_3>).values_[2];
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                    *)local_48);
    } while (vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1);
  }
  return;
}

Assistant:

void PolyMeshT<Kernel>::
calc_vertex_normal_fast(VertexHandle _vh, Normal& _n) const
{
  _n.vectorize(0.0);
  for (ConstVertexFaceIter vf_it = this->cvf_iter(_vh); vf_it.is_valid(); ++vf_it)
    _n += this->normal(*vf_it);
}